

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::AbsCase::compare(AbsCase *this,void **inputs,void **outputs)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  ostream *poVar5;
  int ref0_1;
  int out0_1;
  int in0_1;
  int compNdx_1;
  float local_4c;
  deUint32 ulpDiff0;
  float ref0;
  float out0;
  float in0;
  int compNdx;
  deUint32 maxUlpDiff;
  int mantissaBits;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  AbsCase *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar4->varType);
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  mantissaBits = glu::VarType::getPrecision(&pvVar4->varType);
  maxUlpDiff = glu::getDataTypeScalarSize(scalarSize);
  bVar2 = glu::isDataTypeFloatOrVec(scalarSize);
  if (bVar2) {
    compNdx = getMinMantissaBits(mantissaBits);
    in0 = (float)((1 << (0x17U - (char)compNdx & 0x1f)) + -1);
    for (out0 = 0.0; (int)out0 < (int)maxUlpDiff; out0 = (float)((int)out0 + 1)) {
      ref0 = *(float *)((long)*outputs_local + (long)(int)out0 * 4);
      ulpDiff0 = *(deUint32 *)((long)*_precision + (long)(int)out0 * 4);
      local_4c = de::abs<float>(ref0);
      compNdx_1 = getUlpDiff((float)ulpDiff0,local_4c);
      if ((uint)in0 < (uint)compNdx_1) {
        poVar5 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)out0);
        poVar5 = std::operator<<(poVar5,"] = ");
        HexFloat::HexFloat((HexFloat *)&in0_1,local_4c);
        poVar5 = Functional::operator<<(poVar5,(HexFloat *)&in0_1);
        poVar5 = std::operator<<(poVar5," with ULP threshold ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)in0);
        poVar5 = std::operator<<(poVar5,", got ULP diff ");
        std::ostream::operator<<(poVar5,compNdx_1);
        return false;
      }
    }
  }
  else {
    for (out0_1 = 0; out0_1 < (int)maxUlpDiff; out0_1 = out0_1 + 1) {
      iVar1 = *(int *)((long)*_precision + (long)out0_1 * 4);
      iVar3 = de::abs<int>(*(int *)((long)*outputs_local + (long)out0_1 * 4));
      if (iVar1 != iVar3) {
        poVar5 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,out0_1);
        poVar5 = std::operator<<(poVar5,"] = ");
        std::ostream::operator<<(poVar5,iVar3);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= (1u<<(23-mantissaBits))-1u;

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref0		= de::abs(in0);
				const deUint32	ulpDiff0	= getUlpDiff(out0, ref0);

				if (ulpDiff0 > maxUlpDiff)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " with ULP threshold " << maxUlpDiff << ", got ULP diff " << ulpDiff0;
					return false;
				}
			}
		}
		else
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int	in0		= ((const int*)inputs[0])[compNdx];
				const int	out0	= ((const int*)outputs[0])[compNdx];
				const int	ref0	= de::abs(in0);

				if (out0 != ref0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << ref0;
					return false;
				}
			}
		}

		return true;
	}